

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handy.h
# Opt level: O0

uint mem_eq(void *va,void *vb,size_t len)

{
  byte local_31;
  byte *pbStack_30;
  uint8_t diff;
  uint8_t *b;
  uint8_t *a;
  size_t len_local;
  void *vb_local;
  void *va_local;
  
  local_31 = 0;
  pbStack_30 = (byte *)vb;
  b = (uint8_t *)va;
  a = (uint8_t *)len;
  while (a != (uint8_t *)0x0) {
    local_31 = local_31 | *b ^ *pbStack_30;
    pbStack_30 = pbStack_30 + 1;
    b = b + 1;
    a = a + -1;
  }
  return (uint)((local_31 != 0 ^ 0xffU) & 1);
}

Assistant:

static inline unsigned mem_eq(const void *va, const void *vb, size_t len)
{
  const volatile uint8_t *a = va;
  const volatile uint8_t *b = vb;
  uint8_t diff = 0;

  while (len--)
  {
    diff |= *a++ ^ *b++;
  }

  return !diff;
}